

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxu32 GenStateFixJumps(GenBlock *pBlock,sxi32 nJumpType,sxu32 nJumpDest)

{
  void *pvVar1;
  VmInstr *pVVar2;
  uint local_30;
  sxu32 local_2c;
  sxu32 n;
  sxu32 nFixed;
  VmInstr *pInstr;
  JumpFixup *aFix;
  sxu32 nJumpDest_local;
  sxi32 nJumpType_local;
  GenBlock *pBlock_local;
  
  pvVar1 = (pBlock->aJumpFix).pBase;
  local_2c = 0;
  for (local_30 = 0; local_30 < (pBlock->aJumpFix).nUsed; local_30 = local_30 + 1) {
    if ((-1 < *(int *)((long)pvVar1 + (ulong)local_30 * 8)) &&
       (((nJumpType < 1 || (*(int *)((long)pvVar1 + (ulong)local_30 * 8) == nJumpType)) &&
        (pVVar2 = jx9VmGetInstr(pBlock->pGen->pVm,*(sxu32 *)((long)pvVar1 + (ulong)local_30 * 8 + 4)
                               ), pVVar2 != (VmInstr *)0x0)))) {
      pVVar2->iP2 = nJumpDest;
      local_2c = local_2c + 1;
      *(undefined4 *)((long)pvVar1 + (ulong)local_30 * 8) = 0xffffffff;
    }
  }
  return local_2c;
}

Assistant:

static sxu32 GenStateFixJumps(GenBlock *pBlock, sxi32 nJumpType, sxu32 nJumpDest)
{
	JumpFixup *aFix;
	VmInstr *pInstr;
	sxu32 nFixed; 
	sxu32 n;
	/* Point to the jump fixup table */
	aFix = (JumpFixup *)SySetBasePtr(&pBlock->aJumpFix);
	/* Fix the desired jumps */
	for( nFixed = n = 0 ; n < SySetUsed(&pBlock->aJumpFix) ; ++n ){
		if( aFix[n].nJumpType < 0 ){
			/* Already fixed */
			continue;
		}
		if( nJumpType > 0 && aFix[n].nJumpType != nJumpType ){
			/* Not of our interest */
			continue;
		}
		/* Point to the instruction to fix */
		pInstr = jx9VmGetInstr(pBlock->pGen->pVm, aFix[n].nInstrIdx);
		if( pInstr ){
			pInstr->iP2 = nJumpDest;
			nFixed++;
			/* Mark as fixed */
			aFix[n].nJumpType = -1;
		}
	}
	/* Total number of fixed jumps */
	return nFixed;
}